

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_relaxed.h
# Opt level: O2

uintptr_t __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::get_or_allocate_next_page
          (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
           *this,LfQueue_ProgressGuarantee i_progress_guarantee,uintptr_t i_end_control)

{
  bool bVar1;
  PinResult PVar2;
  uintptr_t uVar3;
  uintptr_t i_new_page;
  uintptr_t expected_next;
  PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2> end_block;
  
  if ((short)i_end_control == -0x40) {
    if (i_end_control == 0xffc0) {
      uVar3 = create_initial_page(this,i_progress_guarantee);
      return uVar3;
    }
  }
  else {
    density_tests::detail::assert_failed<>
              ("i_end_control != 0 && uint_is_aligned(i_end_control, s_alloc_granularity) && i_end_control == get_end_control_block(i_end_control)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
               ,0x17f);
  }
  end_block.m_pinned_page = (void *)0x0;
  end_block.m_allocator = (basic_default_allocator<65536UL> *)this;
  PVar2 = PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2>::pin
                    (&end_block,(void *)i_end_control);
  if (PVar2 != PinFailed) {
    uVar3 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
    if (uVar3 != i_end_control) goto LAB_00edb150;
    i_new_page = create_page(this,i_progress_guarantee);
    if (i_new_page != 0) {
      expected_next = 8;
      bVar1 = raw_atomic_compare_exchange_strong<unsigned_long>
                        ((unsigned_long *)i_end_control,&expected_next,i_new_page + 2,
                         memory_order_seq_cst);
      if (!bVar1) {
        discard_created_page(this,i_new_page);
        uVar3 = i_end_control;
        if (expected_next == 0) goto LAB_00edb150;
        i_new_page = expected_next & 0xfffffffffffffff0;
        if (i_new_page == 0 || (expected_next & 0xfff0) != 0) {
          density_tests::detail::assert_failed<>
                    ("new_page != 0 && uint_is_aligned(new_page, ALLOCATOR_TYPE::page_alignment)",
                     "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
                     ,0x1b0);
        }
      }
      LOCK();
      uVar3 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
      bVar1 = i_end_control == uVar3;
      if (bVar1) {
        (this->m_tail).super___atomic_base<unsigned_long>._M_i = i_new_page;
        uVar3 = i_end_control;
      }
      UNLOCK();
      if (bVar1) {
        uVar3 = i_new_page;
      }
      goto LAB_00edb150;
    }
  }
  uVar3 = 0;
LAB_00edb150:
  PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2>::~PinGuard
            (&end_block);
  return uVar3;
}

Assistant:

uintptr_t get_or_allocate_next_page(
              LfQueue_ProgressGuarantee const i_progress_guarantee, uintptr_t i_end_control)
            {
                DENSITY_ASSERT_INTERNAL(
                  i_end_control != 0 && uint_is_aligned(i_end_control, s_alloc_granularity) &&
                  i_end_control == get_end_control_block(i_end_control));

                if (i_end_control != s_invalid_control_block)
                {
                    /* We are going to access the content of the end control, so we have to do a safe pin
                        (that is, pin the presumed tail, and then check if the tail has changed in the meanwhile). */

                    // try pin
                    PinGuard<ALLOCATOR_TYPE, progress_lock_free> end_block(this);
                    PinResult const pin_result = end_block.pin(i_end_control);
                    if (pin_result == PinFailed) // the pinning can fail only in wait-freedom
                    {
                        return 0;
                    }

                    // check if the tail has changed in the meanwhile
                    auto const updated_tail = m_tail.load(mem_relaxed);
                    if (updated_tail != i_end_control)
                    {
                        return updated_tail;
                    }
                    // now the end control block is pinned, we can safely access it

                    // allocate and setup a new page
                    uintptr_t new_page = create_page(i_progress_guarantee);
                    if (new_page == 0)
                    {
                        return 0;
                    }

                    auto const end_control   = reinterpret_cast<ControlBlock *>(i_end_control);
                    uintptr_t  expected_next = LfQueue_InvalidNextPage;
                    if (!raw_atomic_compare_exchange_strong(
                          &end_control->m_next, &expected_next, new_page + LfQueue_Dead))
                    {
                        /* Some other thread has already linked a new page. We discard the page we
                            have just allocated. */
                        discard_created_page(new_page);

                        /* So i_end_control->m_next may now be the pointer to the next page
                            or 0 (if the page has been consumed in the meanwhile). */
                        if (expected_next == 0)
                        {
                            return updated_tail;
                        }

                        new_page = expected_next & ~LfQueue_AllFlags;
                        DENSITY_ASSERT_INTERNAL(
                          new_page != 0 &&
                          uint_is_aligned(new_page, ALLOCATOR_TYPE::page_alignment));
                    }

                    auto expected_tail = i_end_control;
                    if (m_tail.compare_exchange_strong(expected_tail, new_page))
                        return new_page;
                    else
                        return expected_tail;
                }
                else
                {
                    return create_initial_page(i_progress_guarantee);
                }
            }